

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgmsg.cpp
# Opt level: O0

int DBG_printf_c99(DBG_CHANNEL_ID channel,DBG_LEVEL_ID level,BOOL bHeader,LPSTR file,INT line,
                  LPSTR format,...)

{
  uint uVar1;
  FILE *__stream;
  char in_AL;
  BOOL BVar2;
  INT IVar3;
  int iVar4;
  int *piVar5;
  uint *puVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4f98 [48];
  undefined8 local_4f68;
  undefined8 local_4f58;
  undefined8 local_4f48;
  undefined8 local_4f38;
  undefined8 local_4f28;
  undefined8 local_4f18;
  undefined8 local_4f08;
  undefined8 local_4ef8;
  CPalThread *local_4ee0;
  CPalThread *pthrCurrent;
  long lStack_4ed0;
  int old_errno;
  void *thread_id;
  va_list args;
  int local_4ea4;
  DBG_CHANNEL_ID *pDStack_4ea0;
  INT output_size;
  LPSTR buffer_ptr;
  CHAR *buffer;
  LPSTR format_local;
  INT line_local;
  LPSTR file_local;
  BOOL bHeader_local;
  DBG_LEVEL_ID level_local;
  DBG_CHANNEL_ID channel_local;
  char local_48 [8];
  CHAR indent [51];
  
  if (in_AL != '\0') {
    local_4f68 = in_XMM0_Qa;
    local_4f58 = in_XMM1_Qa;
    local_4f48 = in_XMM2_Qa;
    local_4f38 = in_XMM3_Qa;
    local_4f28 = in_XMM4_Qa;
    local_4f18 = in_XMM5_Qa;
    local_4f08 = in_XMM6_Qa;
    local_4ef8 = in_XMM7_Qa;
  }
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  pthrCurrent._4_4_ = 0;
  local_4ee0 = CorUnix::InternalGetCurrentThread();
  piVar5 = __errno_location();
  pthrCurrent._4_4_ = *piVar5;
  BVar2 = DBG_get_indent(level,format,local_48);
  if (BVar2 != 0) {
    lStack_4ed0 = syscall(0xba);
    if (bHeader == 0) {
      local_4ea4 = 0;
      pDStack_4ea0 = &channel_local;
    }
    else {
      local_4ea4 = snprintf((char *)&channel_local,20000,"{%p-%p} %-5s [%-7s] at %s.%d: ",
                            lStack_4ed0,DBG_get_module_id,dbg_level_names[level],
                            dbg_channel_names[channel],file,line);
      if (20000 < local_4ea4 + 1) {
        fprintf(_stderr,"ERROR : buffer overflow in DBG_printf_gcc");
        goto LAB_003add6e;
      }
      pDStack_4ea0 = (DBG_CHANNEL_ID *)((long)&channel_local + (long)local_4ea4);
    }
    args[0].overflow_arg_area = local_4f98;
    args[0]._0_8_ = &stack0x00000008;
    thread_id._4_4_ = 0x30;
    thread_id._0_4_ = 0x30;
    IVar3 = Silent_PAL_vsnprintf
                      ((LPSTR)pDStack_4ea0,20000 - local_4ea4,format,(__va_list_tag *)&thread_id);
    if (20000 < IVar3 + local_4ea4) {
      fprintf(_stderr,"ERROR : buffer overflow in DBG_printf_c99");
    }
    CorUnix::InternalEnterCriticalSection(local_4ee0,&fprintf_crit_section);
    fprintf((FILE *)output_file,"%s",&channel_local);
    CorUnix::InternalLeaveCriticalSection(local_4ee0,&fprintf_crit_section);
    DBG_printf_c99::call_count = DBG_printf_c99::call_count + 1;
    if (5 < DBG_printf_c99::call_count) {
      DBG_printf_c99::call_count = 0;
      iVar4 = fflush((FILE *)output_file);
      __stream = _stderr;
      if (iVar4 != 0) {
        puVar6 = (uint *)__errno_location();
        uVar1 = *puVar6;
        piVar5 = __errno_location();
        pcVar7 = strerror(*piVar5);
        fprintf(__stream,"ERROR : fflush() failed errno:%d (%s)\n",(ulong)uVar1,pcVar7);
      }
    }
    iVar4 = pthrCurrent._4_4_;
    piVar5 = __errno_location();
    if (iVar4 != *piVar5) {
      fprintf(_stderr,"ERROR: DBG_printf_c99 changed the errno.\n");
      iVar4 = pthrCurrent._4_4_;
      piVar5 = __errno_location();
      *piVar5 = iVar4;
    }
  }
LAB_003add6e:
  if (*(long *)(in_FS_OFFSET + 0x28) != stack0xfffffffffffffff0) {
    __stack_chk_fail();
  }
  return 1;
}

Assistant:

int DBG_printf_c99(DBG_CHANNEL_ID channel, DBG_LEVEL_ID level, BOOL bHeader,
                   LPSTR file, INT line, LPSTR format, ...)
{
    CHAR *buffer = (CHAR*)alloca(DBG_BUFFER_SIZE);
    CHAR indent[MAX_NESTING+1];
    LPSTR buffer_ptr;
    INT output_size;
    va_list args;
    static INT call_count=0;
    void *thread_id;
    int old_errno = 0;
    CPalThread *pthrCurrent = InternalGetCurrentThread();

    old_errno = errno;

    if(!DBG_get_indent(level, format, indent))
    {
        return 1;
    }

    thread_id=  (void *)THREADSilentGetCurrentThreadId();

    if(bHeader)
    {
        output_size=snprintf(buffer, DBG_BUFFER_SIZE,
                             "{%p" MODULE_FORMAT "} %-5s [%-7s] at %s.%d: ", thread_id, MODULE_ID
                             dbg_level_names[level], dbg_channel_names[channel],
                             file, line);

        if(output_size + 1 > DBG_BUFFER_SIZE)
        {
            fprintf(stderr, "ERROR : buffer overflow in DBG_printf_gcc");
            return 1;
        }

        buffer_ptr=buffer+output_size;
    }
    else
    {
        output_size = 0;
        buffer_ptr = buffer;
    }

    va_start(args, format);
    output_size+=Silent_PAL_vsnprintf(buffer_ptr, DBG_BUFFER_SIZE-output_size,
                                      format, args);
    va_end(args);

    if(output_size>DBG_BUFFER_SIZE)
        fprintf(stderr, "ERROR : buffer overflow in DBG_printf_c99");

    /* Use a Critical section before calling printf code to
       avoid holding a libc lock while another thread is calling
       SuspendThread on this one. */

    InternalEnterCriticalSection(pthrCurrent, &fprintf_crit_section);
    fprintf( output_file, "%s", buffer );
    InternalLeaveCriticalSection(pthrCurrent, &fprintf_crit_section);

    /* flush the output to file every once in a while */
    call_count++;
    if(call_count>5)
    {
        call_count=0;
        if ( fflush(output_file) != 0 )
        {
            fprintf(stderr, "ERROR : fflush() failed errno:%d (%s)\n",
                   errno, strerror(errno));
        }
    }

    if ( old_errno != errno )
    {
        fprintf( stderr, "ERROR: DBG_printf_c99 changed the errno.\n" );
        errno = old_errno;
    }

    return 1;
}